

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe.cpp
# Opt level: O0

void fe_pow22523(i32 *out,i32 *z)

{
  int local_ac;
  i32 local_a8;
  int i;
  fe t2;
  i32 local_78 [2];
  fe t1;
  i32 local_48 [2];
  fe t0;
  i32 *z_local;
  i32 *out_local;
  
  fe_sq(local_48,z);
  fe_sq(local_78,local_48);
  for (local_ac = 1; local_ac < 2; local_ac = local_ac + 1) {
    fe_sq(local_78,local_78);
  }
  fe_mul(local_78,z,local_78);
  fe_mul(local_48,local_48,local_78);
  fe_sq(local_48,local_48);
  fe_mul(local_48,local_78,local_48);
  fe_sq(local_78,local_48);
  for (local_ac = 1; local_ac < 5; local_ac = local_ac + 1) {
    fe_sq(local_78,local_78);
  }
  fe_mul(local_48,local_78,local_48);
  fe_sq(local_78,local_48);
  for (local_ac = 1; local_ac < 10; local_ac = local_ac + 1) {
    fe_sq(local_78,local_78);
  }
  fe_mul(local_78,local_78,local_48);
  fe_sq(&local_a8,local_78);
  for (local_ac = 1; local_ac < 0x14; local_ac = local_ac + 1) {
    fe_sq(&local_a8,&local_a8);
  }
  fe_mul(local_78,&local_a8,local_78);
  fe_sq(local_78,local_78);
  for (local_ac = 1; local_ac < 10; local_ac = local_ac + 1) {
    fe_sq(local_78,local_78);
  }
  fe_mul(local_48,local_78,local_48);
  fe_sq(local_78,local_48);
  for (local_ac = 1; local_ac < 0x32; local_ac = local_ac + 1) {
    fe_sq(local_78,local_78);
  }
  fe_mul(local_78,local_78,local_48);
  fe_sq(&local_a8,local_78);
  for (local_ac = 1; local_ac < 100; local_ac = local_ac + 1) {
    fe_sq(&local_a8,&local_a8);
  }
  fe_mul(local_78,&local_a8,local_78);
  fe_sq(local_78,local_78);
  for (local_ac = 1; local_ac < 0x32; local_ac = local_ac + 1) {
    fe_sq(local_78,local_78);
  }
  fe_mul(local_48,local_78,local_48);
  fe_sq(local_48,local_48);
  for (local_ac = 1; local_ac < 2; local_ac = local_ac + 1) {
    fe_sq(local_48,local_48);
  }
  fe_mul(out,local_48,z);
  return;
}

Assistant:

void fe_pow22523(fe out, const fe z) {
    fe t0;
    fe t1;
    fe t2;
    int i;
    fe_sq(t0, z);

    fe_sq(t1, t0);

    for (i = 1; i < 2; ++i) {
        fe_sq(t1, t1);
    }

    fe_mul(t1, z, t1);
    fe_mul(t0, t0, t1);
    fe_sq(t0, t0);

    fe_mul(t0, t1, t0);
    fe_sq(t1, t0);

    for (i = 1; i < 5; ++i) {
        fe_sq(t1, t1);
    }

    fe_mul(t0, t1, t0);
    fe_sq(t1, t0);

    for (i = 1; i < 10; ++i) {
        fe_sq(t1, t1);
    }

    fe_mul(t1, t1, t0);
    fe_sq(t2, t1);

    for (i = 1; i < 20; ++i) {
        fe_sq(t2, t2);
    }

    fe_mul(t1, t2, t1);
    fe_sq(t1, t1);

    for (i = 1; i < 10; ++i) {
        fe_sq(t1, t1);
    }

    fe_mul(t0, t1, t0);
    fe_sq(t1, t0);

    for (i = 1; i < 50; ++i) {
        fe_sq(t1, t1);
    }

    fe_mul(t1, t1, t0);
    fe_sq(t2, t1);

    for (i = 1; i < 100; ++i) {
        fe_sq(t2, t2);
    }

    fe_mul(t1, t2, t1);
    fe_sq(t1, t1);

    for (i = 1; i < 50; ++i) {
        fe_sq(t1, t1);
    }

    fe_mul(t0, t1, t0);
    fe_sq(t0, t0);

    for (i = 1; i < 2; ++i) {
        fe_sq(t0, t0);
    }

    fe_mul(out, t0, z);
}